

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimPatSim2(Gia_Man_t *pGia)

{
  word *pwVar1;
  ulong uVar2;
  ulong uVar3;
  int nWords;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vec_Wrd_t *vSims;
  long lVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long local_50;
  long local_48;
  
  uVar11 = (long)pGia->vSimsPi->nSize / (long)pGia->vCis->nSize;
  nWords = (int)uVar11;
  vSims = Vec_WrdStart(pGia->nObjs * nWords * 2);
  if (pGia->vSimsPi->nSize % pGia->vCis->nSize != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xce,"Vec_Wrd_t *Gia_ManSimPatSim2(Gia_Man_t *)");
  }
  Gia_ManSimPatAssignInputs2(pGia,nWords,vSims,pGia->vSimsPi);
  local_48 = 0;
  uVar10 = 0;
  if (0 < nWords) {
    uVar10 = uVar11 & 0xffffffff;
  }
  local_50 = (long)nWords * 8;
  lVar8 = (long)nWords * 0x10;
  lVar12 = 0;
  while ((iVar6 = (int)lVar12, lVar12 < pGia->nObjs &&
         (pGVar9 = Gia_ManObj(pGia,iVar6), pGVar9 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
      pwVar1 = vSims->pArray;
      iVar4 = Gia_ObjFaninLit0(pGVar9,iVar6);
      uVar5 = (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20);
      iVar6 = Abc_Var2Lit(iVar6 - (uVar5 & 0x1fffffff),uVar5 >> 0x1d & 1);
      iVar7 = Gia_ObjIsXor(pGVar9);
      if (iVar7 != 0) {
        __assert_fail("!Gia_ObjIsXor(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0xb5,
                      "void Gia_ManSimPatSimAnd2(Gia_Man_t *, int, Gia_Obj_t *, int, Vec_Wrd_t *)");
      }
      for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        uVar2 = pwVar1[(long)(iVar6 * nWords) + uVar11];
        uVar3 = pwVar1[(long)(iVar4 * nWords) + uVar11];
        *(ulong *)((long)pwVar1 + uVar11 * 8 + local_48) = uVar2 & uVar3;
        *(ulong *)((long)pwVar1 + uVar11 * 8 + local_50) = ~(uVar2 & uVar3);
      }
    }
    lVar12 = lVar12 + 1;
    local_50 = local_50 + lVar8;
    local_48 = local_48 + lVar8;
  }
  iVar6 = 0;
  while( true ) {
    if (pGia->vCos->nSize <= iVar6) {
      return vSims;
    }
    pGVar9 = Gia_ManCo(pGia,iVar6);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    iVar4 = Gia_ObjId(pGia,pGVar9);
    pwVar1 = vSims->pArray;
    iVar7 = Gia_ObjFaninLit0(pGVar9,iVar4);
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      pwVar1[(long)(iVar4 * nWords) + uVar11] = pwVar1[(long)(iVar7 * nWords) + uVar11];
    }
    iVar6 = iVar6 + 1;
  }
  return vSims;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatSim2( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia);
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords * 2 );
    assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    Gia_ManSimPatAssignInputs2( pGia, nWords, vSims, pGia->vSimsPi );
    Gia_ManForEachAnd( pGia, pObj, i ) 
        Gia_ManSimPatSimAnd2( pGia, i, pObj, nWords, vSims );
    Gia_ManForEachCo( pGia, pObj, i )
        Gia_ManSimPatSimPo2( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
    return vSims;
}